

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_connect(quicly_conn_t **_conn,quicly_context_t *ctx,char *server_name,sockaddr *dest_addr
                  ,sockaddr *src_addr,quicly_cid_plaintext_t *new_cid,ptls_iovec_t address_token,
                  ptls_handshake_properties_t *handshake_properties,
                  quicly_transport_parameters_t *resumed_transport_params)

{
  anon_struct_4_2_d91fd178_for_address_validation *paVar1;
  uint protocol_version;
  ptls_cipher_suite_t *cs;
  quicly_context_t *pqVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  ptls_iovec_t salt;
  uint32_t initcwnd;
  int iVar5;
  quicly_conn_t *conn;
  uint8_t *puVar6;
  ptls_cipher_suite_t **pppVar7;
  size_t sVar8;
  st_ptls_salt_t *psVar9;
  ptls_iovec_t cid;
  size_t max_early_data_size;
  quicly_conn_t **local_88;
  st_ptls_salt_t *local_80;
  ptls_buffer_t local_78;
  size_t epoch_offsets [5];
  
  epoch_offsets[4] = 0;
  epoch_offsets[2] = 0;
  epoch_offsets[3] = 0;
  epoch_offsets[0] = 0;
  epoch_offsets[1] = 0;
  max_early_data_size = 0;
  protocol_version = ctx->initial_version;
  psVar9 = (st_ptls_salt_t *)get_salt_draft27;
  if (protocol_version != 0xff00001b) {
    psVar9 = (st_ptls_salt_t *)0x0;
  }
  local_80 = (st_ptls_salt_t *)get_salt_current;
  if (protocol_version != 0xff00001d) {
    local_80 = psVar9;
  }
  if (local_80 == (st_ptls_salt_t *)0x0) {
    if ((protocol_version & 0xf0f0f0f) != 0xa0a0a0a) {
      return 0xff08;
    }
    local_80 = &quicly_connect::grease_salt;
  }
  local_88 = _conn;
  initcwnd = quicly_cc_calc_initial_cwnd
                       (ctx->initcwnd_packets,(uint16_t)(ctx->transport_params).max_udp_payload_size
                       );
  conn = create_connection(ctx,protocol_version,server_name,dest_addr,src_addr,(ptls_iovec_t *)0x0,
                           new_cid,handshake_properties,initcwnd);
  if (conn == (quicly_conn_t *)0x0) {
    return 0x201;
  }
  paVar1 = &(conn->super).remote.address_validation;
  *(byte *)paVar1 = *(byte *)paVar1 | 3;
  if (address_token.len != 0) {
    puVar6 = (uint8_t *)malloc(address_token.len);
    (conn->token).base = puVar6;
    if (puVar6 == (uint8_t *)0x0) {
      iVar5 = 0x201;
      goto LAB_00119123;
    }
    memcpy(puVar6,address_token.base,address_token.len);
    (conn->token).len = address_token.len;
  }
  *(undefined8 *)((conn->super).original_dcid.cid + 0xd) =
       *(undefined8 *)((conn->super).remote.cid_set.cids[0].cid.cid + 0xd);
  uVar3 = *(undefined8 *)((conn->super).remote.cid_set.cids[0].cid.cid + 8);
  *(undefined8 *)(conn->super).original_dcid.cid =
       *(undefined8 *)(conn->super).remote.cid_set.cids[0].cid.cid;
  *(undefined8 *)((conn->super).original_dcid.cid + 8) = uVar3;
  iVar5 = setup_handshake_space_and_flow(conn,0);
  if (iVar5 == 0) {
    pppVar7 = ctx->tls->cipher_suites;
    if (pppVar7 == (ptls_cipher_suite_t **)0x0) {
      __assert_fail("cs != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x210,"ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *)");
    }
    do {
      cs = *pppVar7;
      pppVar7 = pppVar7 + 1;
    } while (cs->id != 0x1301);
    salt.len = 0x14;
    salt.base = local_80->initial;
    cid.len._0_1_ = (conn->super).remote.cid_set.cids[0].cid.len;
    cid.base = (conn->super).remote.cid_set.cids[0].cid.cid;
    cid.len._1_7_ = 0;
    iVar5 = setup_initial_encryption
                      (cs,&(conn->initial->cipher).ingress,&(conn->initial->cipher).egress,cid,1,
                       salt,conn);
    if (iVar5 == 0) {
      (conn->crypto).transport_params.buf.base = "";
      (conn->crypto).transport_params.buf.capacity = 0;
      (conn->crypto).transport_params.buf.off = 0;
      (conn->crypto).transport_params.buf.is_allocated = 0;
      pqVar2 = (conn->super).ctx;
      if ((pqVar2->field_0xa2 & 1) == 0) {
        sVar8 = 0;
      }
      else {
        sVar8 = (size_t)pqVar2->initial_egress_max_udp_payload_size;
      }
      iVar5 = quicly_encode_transport_parameter_list
                        (&(conn->crypto).transport_params.buf,&pqVar2->transport_params,
                         (quicly_cid_t *)0x0,&(conn->super).local.cid_set.cids[0].cid,
                         (quicly_cid_t *)0x0,(void *)0x0,sVar8);
      if (iVar5 == 0) {
        puVar6 = (conn->crypto).transport_params.buf.base;
        sVar8 = (conn->crypto).transport_params.buf.off;
        (conn->crypto).transport_params.ext[0].type = 0xffa5;
        (conn->crypto).transport_params.ext[0].data.base = puVar6;
        (conn->crypto).transport_params.ext[0].data.len = sVar8;
        (conn->crypto).transport_params.ext[1].type = 0xffff;
        *(undefined8 *)&(conn->crypto).transport_params.ext[1].field_0x2 = 0;
        *(undefined8 *)((long)&(conn->crypto).transport_params.ext[1].data.base + 2) = 0;
        (conn->crypto).transport_params.ext[1].data.len = 0;
        (conn->crypto).handshake_properties.additional_extensions =
             (conn->crypto).transport_params.ext;
        (conn->crypto).handshake_properties.collected_extensions = client_collected_extensions;
        local_78.base = "";
        local_78.capacity = 0;
        local_78.off = 0;
        local_78._24_8_ = local_78._24_8_ & 0xffffffff00000000;
        if (resumed_transport_params != (quicly_transport_parameters_t *)0x0) {
          (conn->crypto).handshake_properties.field_0.client.max_early_data_size =
               &max_early_data_size;
        }
        iVar5 = ptls_handle_message((conn->crypto).tls,&local_78,epoch_offsets,0,(void *)0x0,0,
                                    &(conn->crypto).handshake_properties);
        (conn->crypto).handshake_properties.field_0.client.max_early_data_size = (size_t *)0x0;
        if (iVar5 == 0x202) {
          write_crypto_data(conn,&local_78,epoch_offsets);
          ptls_buffer__release_memory(&local_78);
          local_78.off = 0;
          local_78._24_8_ = 0;
          local_78.base = (uint8_t *)0x0;
          local_78.capacity = 0;
          if (max_early_data_size != 0) {
            (conn->super).remote.transport_params.active_connection_id_limit =
                 resumed_transport_params->active_connection_id_limit;
            (conn->super).remote.transport_params.max_data = resumed_transport_params->max_data;
            uVar4 = (resumed_transport_params->max_stream_data).bidi_remote;
            (conn->super).remote.transport_params.max_stream_data.bidi_local =
                 (resumed_transport_params->max_stream_data).bidi_local;
            (conn->super).remote.transport_params.max_stream_data.bidi_remote = uVar4;
            (conn->super).remote.transport_params.max_stream_data.uni =
                 (resumed_transport_params->max_stream_data).uni;
            uVar4 = resumed_transport_params->max_streams_uni;
            (conn->super).remote.transport_params.max_streams_bidi =
                 resumed_transport_params->max_streams_bidi;
            (conn->super).remote.transport_params.max_streams_uni = uVar4;
            iVar5 = apply_remote_transport_params(conn);
            if (iVar5 != 0) goto LAB_00119123;
          }
          *local_88 = conn;
          unlock_now(conn);
          return 0;
        }
        if (iVar5 < 1) {
          __assert_fail("ret > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x8ce,
                        "int quicly_connect(quicly_conn_t **, quicly_context_t *, const char *, struct sockaddr *, struct sockaddr *, const quicly_cid_plaintext_t *, ptls_iovec_t, ptls_handshake_properties_t *, const quicly_transport_parameters_t *)"
                       );
        }
      }
    }
  }
LAB_00119123:
  unlock_now(conn);
  quicly_free(conn);
  return iVar5;
}

Assistant:

int quicly_connect(quicly_conn_t **_conn, quicly_context_t *ctx, const char *server_name, struct sockaddr *dest_addr,
                   struct sockaddr *src_addr, const quicly_cid_plaintext_t *new_cid, ptls_iovec_t address_token,
                   ptls_handshake_properties_t *handshake_properties, const quicly_transport_parameters_t *resumed_transport_params)
{
    const struct st_ptls_salt_t *salt;
    quicly_conn_t *conn = NULL;
    const quicly_cid_t *server_cid;
    ptls_buffer_t buf;
    size_t epoch_offsets[5] = {0};
    size_t max_early_data_size = 0;
    int ret;

    if ((salt = get_salt(ctx->initial_version)) == NULL) {
        if ((ctx->initial_version & 0x0f0f0f0f) == 0x0a0a0a0a) {
            /* greasing version, use our own greasing salt */
            static const struct st_ptls_salt_t grease_salt = {.initial = {0xde, 0xad, 0xbe, 0xef, 0xde, 0xad, 0xbe,
                                                                          0xef, 0xde, 0xad, 0xbe, 0xef, 0xde, 0xad,
                                                                          0xbe, 0xef, 0xde, 0xad, 0xbe, 0xef}};
            salt = &grease_salt;
        } else {
            ret = QUICLY_ERROR_INVALID_INITIAL_VERSION;
            goto Exit;
        }
    }

    if ((conn = create_connection(
             ctx, ctx->initial_version, server_name, dest_addr, src_addr, NULL, new_cid, handshake_properties,
             quicly_cc_calc_initial_cwnd(ctx->initcwnd_packets, ctx->transport_params.max_udp_payload_size))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    conn->super.remote.address_validation.validated = 1;
    conn->super.remote.address_validation.send_probe = 1;
    if (address_token.len != 0) {
        if ((conn->token.base = malloc(address_token.len)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        memcpy(conn->token.base, address_token.base, address_token.len);
        conn->token.len = address_token.len;
    }
    server_cid = quicly_get_remote_cid(conn);
    conn->super.original_dcid = *server_cid;

    QUICLY_PROBE(CONNECT, conn, conn->stash.now, conn->super.version);

    if ((ret = setup_handshake_space_and_flow(conn, QUICLY_EPOCH_INITIAL)) != 0)
        goto Exit;
    if ((ret = setup_initial_encryption(get_aes128gcmsha256(ctx), &conn->initial->cipher.ingress, &conn->initial->cipher.egress,
                                        ptls_iovec_init(server_cid->cid, server_cid->len), 1,
                                        ptls_iovec_init(salt->initial, sizeof(salt->initial)), conn)) != 0)
        goto Exit;

    /* handshake (we always encode authentication CIDs, as we do not (yet) regenerate ClientHello when receiving Retry) */
    ptls_buffer_init(&conn->crypto.transport_params.buf, "", 0);
    if ((ret = quicly_encode_transport_parameter_list(
             &conn->crypto.transport_params.buf, &conn->super.ctx->transport_params, NULL, &conn->super.local.cid_set.cids[0].cid,
             NULL, NULL, conn->super.ctx->expand_client_hello ? conn->super.ctx->initial_egress_max_udp_payload_size : 0)) != 0)
        goto Exit;
    conn->crypto.transport_params.ext[0] =
        (ptls_raw_extension_t){QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS,
                               {conn->crypto.transport_params.buf.base, conn->crypto.transport_params.buf.off}};
    conn->crypto.transport_params.ext[1] = (ptls_raw_extension_t){UINT16_MAX};
    conn->crypto.handshake_properties.additional_extensions = conn->crypto.transport_params.ext;
    conn->crypto.handshake_properties.collected_extensions = client_collected_extensions;

    ptls_buffer_init(&buf, "", 0);
    if (resumed_transport_params != NULL)
        conn->crypto.handshake_properties.client.max_early_data_size = &max_early_data_size;
    ret = ptls_handle_message(conn->crypto.tls, &buf, epoch_offsets, 0, NULL, 0, &conn->crypto.handshake_properties);
    conn->crypto.handshake_properties.client.max_early_data_size = NULL;
    if (ret != PTLS_ERROR_IN_PROGRESS) {
        assert(ret > 0); /* no QUIC errors */
        goto Exit;
    }
    write_crypto_data(conn, &buf, epoch_offsets);
    ptls_buffer_dispose(&buf);

    if (max_early_data_size != 0) {
        /* when attempting 0-RTT, apply the remembered transport parameters */
#define APPLY(n) conn->super.remote.transport_params.n = resumed_transport_params->n
        APPLY(active_connection_id_limit);
        APPLY(max_data);
        APPLY(max_stream_data.bidi_local);
        APPLY(max_stream_data.bidi_remote);
        APPLY(max_stream_data.uni);
        APPLY(max_streams_bidi);
        APPLY(max_streams_uni);
#undef APPLY
        if ((ret = apply_remote_transport_params(conn)) != 0)
            goto Exit;
    }

    *_conn = conn;
    ret = 0;

Exit:
    if (conn != NULL)
        unlock_now(conn);
    if (ret != 0) {
        if (conn != NULL)
            quicly_free(conn);
    }
    return ret;
}